

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O2

void replay_term(global_state_t *g)

{
  __cilkrts_worker *p_Var1;
  local_state *plVar2;
  replay_entry_t *this;
  long lVar3;
  
  if (g->record_replay_file_name != (char *)0x0) {
    __cilkrts_free(g->record_replay_file_name);
  }
  lVar3 = 0;
  do {
    if (g->total_workers <= lVar3) {
      return;
    }
    p_Var1 = g->workers[lVar3];
    plVar2 = p_Var1->l;
    if ((FILE *)plVar2->record_replay_fptr != (FILE *)0x0) {
      fclose((FILE *)plVar2->record_replay_fptr);
      plVar2 = p_Var1->l;
    }
    this = plVar2->replay_list_root;
    if (this != (replay_entry_t *)0x0) {
      if (plVar2->replay_list_entry->m_type != ped_type_last) {
        __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/record-replay.cpp"
                      ,0x2f1,"ped_type_last == w->l->replay_list_entry->m_type");
      }
      for (; this->m_type != ped_type_last; this = this + 1) {
        replay_entry_t::unload(this);
      }
      __cilkrts_free(p_Var1->l->replay_list_root);
      plVar2 = p_Var1->l;
      plVar2->replay_list_root = (replay_entry_t *)0x0;
      plVar2->replay_list_entry = (replay_entry_t *)0x0;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void replay_term(global_state_t *g)
{
    // Free memory for the record/replay log file name, if we've got one
    if (g->record_replay_file_name)
        __cilkrts_free(g->record_replay_file_name);

    // Per-worker cleanup
    for(int i = 0; i < g->total_workers; ++i)
    {
        __cilkrts_worker *w = g->workers[i];

        // Close the log files, if we've opened them
        if(w->l->record_replay_fptr)
            fclose(w->l->record_replay_fptr);

        if (w->l->replay_list_root)
        {
            // We should have consumed the entire list
            CILK_ASSERT(ped_type_last == w->l->replay_list_entry->m_type);

            replay_entry_t *entry = w->l->replay_list_root;
            while (ped_type_last != entry->m_type)
            {
                // Free the pedigree memory for each entry
                entry->unload();
                entry++;
            }
            __cilkrts_free(w->l->replay_list_root);
            w->l->replay_list_root = NULL;
            w->l->replay_list_entry = NULL;
        }
    }
}